

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::handleEntryPointAttributes
          (HlslParseContext *this,TSourceLoc *loc,TAttributes *attributes)

{
  _List_node_base *this_00;
  TVertexSpacing TVar1;
  TVertexOrder TVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  TLayoutGeometry TVar7;
  char *pcVar8;
  TIntermediate *pTVar9;
  char *pcVar10;
  _List_node_header *p_Var11;
  _List_node_base *p_Var12;
  _func_int **pp_Var13;
  TLayoutGeometry TVar14;
  TVertexOrder TVar15;
  long lVar16;
  long lVar17;
  TString domainStr;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_38;
  
  p_Var12 = (attributes->
            super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
            super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  p_Var11 = &(attributes->
             super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>)
             .
             super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
             ._M_impl._M_node;
  if ((_List_node_header *)p_Var12 != p_Var11) {
    local_38 = &this->patchConstantFunctionName;
    do {
      if (0x14 < *(int *)&p_Var12[1]._M_next - 4U) {
switchD_0040da62_caseD_6:
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                  (this,loc,"attribute does not apply to entry point","","");
        goto switchD_0040da62_caseD_16;
      }
      this_00 = p_Var12 + 1;
      switch(*(int *)&p_Var12[1]._M_next) {
      case 4:
        local_60._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        local_60._M_string_length = 0;
        local_60.field_2._M_local_buf[0] = '\0';
        bVar4 = TAttributeArgs::getString((TAttributeArgs *)this_00,&local_60,0,true);
        if (!bVar4) {
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar10 = "invalid domain";
          goto LAB_0040df10;
        }
        iVar5 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (&local_60,"tri");
        if (iVar5 == 0) {
          TVar14 = ElgTriangles;
        }
        else {
          iVar5 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(&local_60,"quad");
          if (iVar5 == 0) {
            TVar14 = ElgQuads;
          }
          else {
            iVar5 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(&local_60,"isoline");
            if (iVar5 == 0) {
              TVar14 = ElgIsolines;
            }
            else {
              TVar14 = ElgNone;
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"unsupported domain type",local_60._M_dataplus._M_p,"");
            }
          }
        }
        if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation)
        {
          pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          TVar7 = pTVar9->inputPrimitive;
          if (TVar7 == ElgNone) {
            pTVar9->inputPrimitive = TVar14;
          }
          else {
LAB_0040dfed:
            if (TVar7 != TVar14) {
              pcVar8 = "none";
              if (TVar14 - ElgPoints < 9) {
                pcVar8 = *(char **)(&DAT_00b09ea0 + (ulong)(TVar14 - ElgPoints) * 8);
              }
              pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
              pcVar10 = "cannot change previously set domain";
              goto LAB_0040df1a;
            }
          }
        }
        else {
          pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          TVar7 = pTVar9->outputPrimitive;
          if (TVar7 != ElgNone) goto LAB_0040dfed;
          pTVar9->outputPrimitive = TVar14;
        }
        break;
      case 5:
        ((this->super_TParseContextBase).super_TParseVersions.intermediate)->earlyFragmentTests =
             true;
        break;
      default:
        goto switchD_0040da62_caseD_6;
      case 9:
        bVar4 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&local_60,0);
        if (!bVar4) {
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar10 = "invalid instance";
          goto LAB_0040df10;
        }
        pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar5 = pTVar9->invocations;
        if (iVar5 == -1) {
          pTVar9->invocations = (int)local_60._M_dataplus.super_allocator_type.allocator;
        }
        else if (iVar5 != (int)local_60._M_dataplus.super_allocator_type.allocator) {
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar10 = "cannot change previously set instance attribute";
          goto LAB_0040df10;
        }
        break;
      case 0xb:
        lVar6 = (*(code *)(p_Var12[1]._M_prev)->_M_next[0x19]._M_prev)();
        lVar17 = *(long *)(lVar6 + 8);
        if (0 < (int)((ulong)(*(long *)(lVar6 + 0x10) - lVar17) >> 3)) {
          lVar16 = 0;
          do {
            pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            lVar17 = (**(code **)(**(long **)(lVar17 + lVar16 * 8) + 0x28))();
            if (pTVar9->localSizeNotDefault[lVar16] == false) {
              iVar5 = **(int **)(*(long *)(lVar17 + 0xc0) + 8);
              pTVar9->localSizeNotDefault[lVar16] = true;
              pTVar9->localSize[lVar16] = iVar5;
            }
            lVar16 = lVar16 + 1;
            lVar17 = *(long *)(lVar6 + 8);
          } while (lVar16 < (int)((ulong)(*(long *)(lVar6 + 0x10) - lVar17) >> 3));
        }
        break;
      case 0xc:
        bVar4 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&local_60,0);
        if (!bVar4) {
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar10 = "invalid maxvertexcount";
          goto LAB_0040df10;
        }
        pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        if (pTVar9->vertices == -1) {
LAB_0040df35:
          pTVar9->vertices = (int)local_60._M_dataplus.super_allocator_type.allocator;
        }
        else if (pTVar9->vertices != (int)local_60._M_dataplus.super_allocator_type.allocator) {
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar10 = "cannot change previously set maxvertexcount attribute";
          goto LAB_0040df10;
        }
        break;
      case 0xd:
        bVar4 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&local_60,0);
        if (bVar4) {
          pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          if (pTVar9->vertices == -1) goto LAB_0040df35;
          if (pTVar9->vertices == (int)local_60._M_dataplus.super_allocator_type.allocator) break;
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar10 = "cannot change previously set outputcontrolpoints attribute";
        }
        else {
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar10 = "invalid outputcontrolpoints";
        }
LAB_0040df10:
        pcVar8 = "";
        goto LAB_0040df1a;
      case 0xe:
        local_60._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        local_60._M_string_length = 0;
        local_60.field_2._M_local_buf[0] = '\0';
        bVar4 = TAttributeArgs::getString((TAttributeArgs *)this_00,&local_60,0,true);
        if (!bVar4) {
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar10 = "invalid outputtopology";
          goto LAB_0040df10;
        }
        iVar5 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (&local_60,"point");
        if (iVar5 == 0) {
          ((this->super_TParseContextBase).super_TParseVersions.intermediate)->pointMode = true;
LAB_0040df4b:
          TVar15 = EvoNone;
          bVar4 = true;
          pcVar10 = "none";
          bVar3 = true;
          TVar14 = ElgNone;
        }
        else {
          iVar5 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(&local_60,"line");
          if (iVar5 == 0) {
            TVar14 = ElgIsolines;
            TVar15 = EvoNone;
            bVar4 = true;
            pcVar10 = "none";
          }
          else {
            iVar5 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(&local_60,"triangle_cw");
            TVar14 = ElgTriangles;
            if (iVar5 == 0) {
              TVar15 = EvoCw;
              bVar4 = false;
              pcVar10 = "cw";
            }
            else {
              iVar5 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(&local_60,"triangle_ccw");
              if (iVar5 != 0) {
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,"unsupported outputtopology type",local_60._M_dataplus._M_p,"");
                goto LAB_0040df4b;
              }
              TVar15 = EvoCcw;
              bVar4 = false;
              pcVar10 = "ccw";
            }
          }
          bVar3 = false;
        }
        if (!bVar4) {
          pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          TVar2 = pTVar9->vertexOrder;
          if (TVar2 == EvoNone) {
            pTVar9->vertexOrder = TVar15;
          }
          else if (TVar2 != TVar15) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cannot change previously set outputtopology",pcVar10,"");
          }
        }
        if ((!bVar3) &&
           (pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate,
           pTVar9->outputPrimitive == ElgNone)) {
          pTVar9->outputPrimitive = TVar14;
        }
        break;
      case 0xf:
        local_60._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        local_60._M_string_length = 0;
        local_60.field_2._M_local_buf[0] = '\0';
        bVar4 = TAttributeArgs::getString((TAttributeArgs *)this_00,&local_60,0,true);
        if (!bVar4) {
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar10 = "invalid partitioning";
          goto LAB_0040df10;
        }
        iVar5 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (&local_60,"integer");
        if (iVar5 == 0) {
          lVar17 = 1;
        }
        else {
          iVar5 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(&local_60,"fractional_even");
          if (iVar5 == 0) {
            lVar17 = 2;
          }
          else {
            iVar5 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(&local_60,"fractional_odd");
            if (iVar5 == 0) {
              lVar17 = 3;
            }
            else {
              lVar17 = 0;
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"unsupported partitioning type",local_60._M_dataplus._M_p,"");
            }
          }
        }
        pTVar9 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        TVar1 = pTVar9->vertexSpacing;
        if (TVar1 == EvsNone) {
          pTVar9->vertexSpacing = (TVertexSpacing)lVar17;
          break;
        }
        if (TVar1 == (TVertexSpacing)lVar17) break;
        pcVar8 = (char *)((long)&DAT_0085fe74 + (long)(int)(&DAT_0085fe74)[lVar17]);
        pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar10 = "cannot change previously set partitioning";
LAB_0040df1a:
        (*pp_Var13[0x2d])(this,loc,pcVar10,pcVar8,"");
        break;
      case 0x10:
        local_60._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        local_60._M_string_length = 0;
        local_60.field_2._M_local_buf[0] = '\0';
        bVar4 = TAttributeArgs::getString((TAttributeArgs *)this_00,&local_60,0,false);
        if (!bVar4) {
          pp_Var13 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar10 = "invalid patch constant function";
          goto LAB_0040df10;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_assign(local_38,&local_60);
        break;
      case 0x16:
      case 0x18:
        break;
      }
switchD_0040da62_caseD_16:
      p_Var12 = p_Var12->_M_next;
    } while ((_List_node_header *)p_Var12 != p_Var11);
  }
  return;
}

Assistant:

void HlslParseContext::handleEntryPointAttributes(const TSourceLoc& loc, const TAttributes& attributes)
{
    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        switch (it->name) {
        case EatNumThreads:
        {
            const TIntermSequence& sequence = it->args->getSequence();
            for (int lid = 0; lid < int(sequence.size()); ++lid)
                intermediate.setLocalSize(lid, sequence[lid]->getAsConstantUnion()->getConstArray()[0].getIConst());
            break;
        }
        case EatInstance: 
        {
            int invocations;

            if (!it->getInt(invocations)) {
                error(loc, "invalid instance", "", "");
            } else {
                if (!intermediate.setInvocations(invocations))
                    error(loc, "cannot change previously set instance attribute", "", "");
            }
            break;
        }
        case EatMaxVertexCount:
        {
            int maxVertexCount;

            if (! it->getInt(maxVertexCount)) {
                error(loc, "invalid maxvertexcount", "", "");
            } else {
                if (! intermediate.setVertices(maxVertexCount))
                    error(loc, "cannot change previously set maxvertexcount attribute", "", "");
            }
            break;
        }
        case EatPatchConstantFunc:
        {
            TString pcfName;
            if (! it->getString(pcfName, 0, false)) {
                error(loc, "invalid patch constant function", "", "");
            } else {
                patchConstantFunctionName = pcfName;
            }
            break;
        }
        case EatDomain:
        {
            // Handle [domain("...")]
            TString domainStr;
            if (! it->getString(domainStr)) {
                error(loc, "invalid domain", "", "");
            } else {
                TLayoutGeometry domain = ElgNone;

                if (domainStr == "tri") {
                    domain = ElgTriangles;
                } else if (domainStr == "quad") {
                    domain = ElgQuads;
                } else if (domainStr == "isoline") {
                    domain = ElgIsolines;
                } else {
                    error(loc, "unsupported domain type", domainStr.c_str(), "");
                }

                if (language == EShLangTessEvaluation) {
                    if (! intermediate.setInputPrimitive(domain))
                        error(loc, "cannot change previously set domain", TQualifier::getGeometryString(domain), "");
                } else {
                    if (! intermediate.setOutputPrimitive(domain))
                        error(loc, "cannot change previously set domain", TQualifier::getGeometryString(domain), "");
                }
            }
            break;
        }
        case EatOutputTopology:
        {
            // Handle [outputtopology("...")]
            TString topologyStr;
            if (! it->getString(topologyStr)) {
                error(loc, "invalid outputtopology", "", "");
            } else {
                TVertexOrder vertexOrder = EvoNone;
                TLayoutGeometry primitive = ElgNone;

                if (topologyStr == "point") {
                    intermediate.setPointMode();
                } else if (topologyStr == "line") {
                    primitive = ElgIsolines;
                } else if (topologyStr == "triangle_cw") {
                    vertexOrder = EvoCw;
                    primitive = ElgTriangles;
                } else if (topologyStr == "triangle_ccw") {
                    vertexOrder = EvoCcw;
                    primitive = ElgTriangles;
                } else {
                    error(loc, "unsupported outputtopology type", topologyStr.c_str(), "");
                }

                if (vertexOrder != EvoNone) {
                    if (! intermediate.setVertexOrder(vertexOrder)) {
                        error(loc, "cannot change previously set outputtopology",
                              TQualifier::getVertexOrderString(vertexOrder), "");
                    }
                }
                if (primitive != ElgNone)
                    intermediate.setOutputPrimitive(primitive);
            }
            break;
        }
        case EatPartitioning:
        {
            // Handle [partitioning("...")]
            TString partitionStr;
            if (! it->getString(partitionStr)) {
                error(loc, "invalid partitioning", "", "");
            } else {
                TVertexSpacing partitioning = EvsNone;

                if (partitionStr == "integer") {
                    partitioning = EvsEqual;
                } else if (partitionStr == "fractional_even") {
                    partitioning = EvsFractionalEven;
                } else if (partitionStr == "fractional_odd") {
                    partitioning = EvsFractionalOdd;
                    //} else if (partition == "pow2") { // TODO: currently nothing to map this to.
                } else {
                    error(loc, "unsupported partitioning type", partitionStr.c_str(), "");
                }

                if (! intermediate.setVertexSpacing(partitioning))
                    error(loc, "cannot change previously set partitioning",
                          TQualifier::getVertexSpacingString(partitioning), "");
            }
            break;
        }
        case EatOutputControlPoints:
        {
            // Handle [outputcontrolpoints("...")]
            int ctrlPoints;
            if (! it->getInt(ctrlPoints)) {
                error(loc, "invalid outputcontrolpoints", "", "");
            } else {
                if (! intermediate.setVertices(ctrlPoints)) {
                    error(loc, "cannot change previously set outputcontrolpoints attribute", "", "");
                }
            }
            break;
        }
        case EatEarlyDepthStencil:
            intermediate.setEarlyFragmentTests();
            break;
        case EatBuiltIn:
        case EatLocation:
            // tolerate these because of dual use of entrypoint and type attributes
            break;
        default:
            warn(loc, "attribute does not apply to entry point", "", "");
            break;
        }
    }
}